

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O2

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::
sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
::
invoke<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,
          sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
          *this,location<std::vector<char,_std::allocator<char>_>_> *loc,
          region<std::vector<char,_std::allocator<char>_>_> *reg,
          __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> first)

{
  value_type *other;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> rslt
  ;
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
  local_c0;
  location<std::vector<char,_std::allocator<char>_>_> local_70;
  
  repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>::
  invoke<std::vector<char,std::allocator<char>>>
            (&local_c0,
             (repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>> *)this,
             loc);
  if (local_c0.is_ok_ == false) {
    location<std::vector<char,_std::allocator<char>_>_>::reset
              ((location<std::vector<char,_std::allocator<char>_>_> *)this,(const_iterator)reg);
    __return_storage_ptr__->is_ok_ = false;
    this = (sequence<toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::exactly<2ul>>,toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
            *)reg;
  }
  else {
    other = result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
            ::unwrap(&local_c0);
    region<std::vector<char,_std::allocator<char>_>_>::operator+=
              ((region<std::vector<char,_std::allocator<char>_>_> *)loc,other);
    region<std::vector<char,_std::allocator<char>_>_>::region
              ((region<std::vector<char,_std::allocator<char>_>_> *)&local_70,
               (region<std::vector<char,_std::allocator<char>_>_> *)loc);
    sequence<toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
    ::
    invoke<std::vector<char,std::allocator<char>>,__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              (__return_storage_ptr__,
               (sequence<toml::detail::maybe<toml::detail::sequence<toml::detail::character<(char)46>,toml::detail::repeat<toml::detail::in_range<(char)48,(char)57>,toml::detail::at_least<1ul>>>>>
                *)this,&local_70,reg,first);
    region<std::vector<char,_std::allocator<char>_>_>::~region
              ((region<std::vector<char,_std::allocator<char>_>_> *)&local_70);
  }
  result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>::
  cleanup(&local_c0,(EVP_PKEY_CTX *)this);
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc, region<Cont> reg, Iterator first)
    {
        const auto rslt = Head::invoke(loc);
        if(rslt.is_err())
        {
            loc.reset(first);
            return none();
        }
        reg += rslt.unwrap(); // concat regions
        return sequence<Tail...>::invoke(loc, std::move(reg), first);
    }